

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void NULLCIO::SetConsoleCursorPos(int x,int y)

{
  nullcThrowError("SetConsoleCursorPos: supported only under Windows");
  return;
}

Assistant:

void SetConsoleCursorPos(int x, int y)
	{
#if !defined(_MSC_VER)
		(void)x;
		(void)y;

		nullcThrowError("SetConsoleCursorPos: supported only under Windows");
#else	
		if(x < 0 || y < 0)
		{
			nullcThrowError("SetConsoleCursorPos: Negative values are not allowed");
			return;
		}
		COORD coords;
		coords.X = (short)x;
		coords.Y = (short)y;
		HANDLE conStdOut = GetStdHandle(STD_OUTPUT_HANDLE);
		SetConsoleCursorPosition(conStdOut, coords);
#endif
	}